

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigMiter.c
# Opt level: O0

int Saig_ManDemiterSimpleDiff(Aig_Man_t *p,Aig_Man_t **ppAig0,Aig_Man_t **ppAig1)

{
  int iVar1;
  uint uVar2;
  Aig_Man_t *pAVar3;
  char *pcVar4;
  int local_54;
  Aig_Obj_t *pAStack_50;
  int i;
  Aig_Obj_t *pObj1;
  Aig_Obj_t *pObj0;
  Aig_Obj_t *pObj;
  Vec_Ptr_t *vSet1;
  Vec_Ptr_t *vSet0;
  Aig_Man_t **ppAig1_local;
  Aig_Man_t **ppAig0_local;
  Aig_Man_t *p_local;
  
  vSet0 = (Vec_Ptr_t *)ppAig1;
  ppAig1_local = ppAig0;
  ppAig0_local = (Aig_Man_t **)p;
  iVar1 = Aig_ManRegNum(p);
  if ((iVar1 == 0) || (uVar2 = Aig_ManRegNum((Aig_Man_t *)ppAig0_local), (uVar2 & 1) != 0)) {
    p_local._4_4_ = 0;
  }
  else {
    Saig_ManDemiterMarkPos((Aig_Man_t *)ppAig0_local);
    iVar1 = Saig_ManPoNum((Aig_Man_t *)ppAig0_local);
    vSet1 = Vec_PtrAlloc(iVar1);
    iVar1 = Saig_ManPoNum((Aig_Man_t *)ppAig0_local);
    pObj = (Aig_Obj_t *)Vec_PtrAlloc(iVar1);
    for (local_54 = 0; iVar1 = Saig_ManPoNum((Aig_Man_t *)ppAig0_local), local_54 < iVar1;
        local_54 = local_54 + 1) {
      pObj0 = (Aig_Obj_t *)Vec_PtrEntry((Vec_Ptr_t *)ppAig0_local[3],local_54);
      iVar1 = Saig_ManDemiterCheckPo
                        ((Aig_Man_t *)ppAig0_local,pObj0,&pObj1,&stack0xffffffffffffffb0);
      if (iVar1 == 0) {
        Vec_PtrFree(vSet1);
        Vec_PtrFree((Vec_Ptr_t *)pObj);
        Aig_ManCleanMarkAB((Aig_Man_t *)ppAig0_local);
        return 0;
      }
      Vec_PtrPush(vSet1,pObj1);
      Vec_PtrPush((Vec_Ptr_t *)pObj,pAStack_50);
    }
    pAVar3 = Aig_ManDupNodesHalf((Aig_Man_t *)ppAig0_local,vSet1,0);
    *ppAig1_local = pAVar3;
    if ((*ppAig1_local)->pName != (char *)0x0) {
      free((*ppAig1_local)->pName);
      (*ppAig1_local)->pName = (char *)0x0;
    }
    pcVar4 = Abc_UtilStrsav("part0");
    (*ppAig1_local)->pName = pcVar4;
    pAVar3 = Aig_ManDupNodesHalf((Aig_Man_t *)ppAig0_local,(Vec_Ptr_t *)pObj,1);
    *(Aig_Man_t **)vSet0 = pAVar3;
    if (**(long **)vSet0 != 0) {
      free((void *)**(undefined8 **)vSet0);
      **(undefined8 **)vSet0 = 0;
    }
    pcVar4 = Abc_UtilStrsav("part1");
    **(undefined8 **)vSet0 = pcVar4;
    Vec_PtrFree(vSet1);
    Vec_PtrFree((Vec_Ptr_t *)pObj);
    Aig_ManCleanMarkAB((Aig_Man_t *)ppAig0_local);
    p_local._4_4_ = 1;
  }
  return p_local._4_4_;
}

Assistant:

int Saig_ManDemiterSimpleDiff( Aig_Man_t * p, Aig_Man_t ** ppAig0, Aig_Man_t ** ppAig1 )
{
    Vec_Ptr_t * vSet0, * vSet1;
    Aig_Obj_t * pObj, * pObj0, * pObj1;
    int i;
    if ( Aig_ManRegNum(p) == 0 || (Aig_ManRegNum(p) & 1) )
        return 0;
    Saig_ManDemiterMarkPos( p );
    vSet0 = Vec_PtrAlloc( Saig_ManPoNum(p) );
    vSet1 = Vec_PtrAlloc( Saig_ManPoNum(p) );
    Saig_ManForEachPo( p, pObj, i )
    {
        if ( !Saig_ManDemiterCheckPo( p, pObj, &pObj0, &pObj1 ) )
        {
            Vec_PtrFree( vSet0 );
            Vec_PtrFree( vSet1 );
            Aig_ManCleanMarkAB( p );
            return 0;
        }
        Vec_PtrPush( vSet0, pObj0 );
        Vec_PtrPush( vSet1, pObj1 );
    }
    // create new AIG
    *ppAig0 = Aig_ManDupNodesHalf( p, vSet0, 0 );
    ABC_FREE( (*ppAig0)->pName );
    (*ppAig0)->pName = Abc_UtilStrsav( "part0" );
    // create new AIGs
    *ppAig1 = Aig_ManDupNodesHalf( p, vSet1, 1 );
    ABC_FREE( (*ppAig1)->pName );
    (*ppAig1)->pName = Abc_UtilStrsav( "part1" );
    // cleanup
    Vec_PtrFree( vSet0 );
    Vec_PtrFree( vSet1 );
    Aig_ManCleanMarkAB( p );
    return 1;
}